

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadT<v128>
          (BinaryReader *this,v128 *out_value,char *type_name,char *desc)

{
  uint8_t *puVar1;
  Offset OVar2;
  char *desc_local;
  char *type_name_local;
  v128 *out_value_local;
  BinaryReader *this_local;
  
  if (this->read_end_ < (this->state_).offset + 0x10) {
    PrintError(this,"unable to read %s: %s",type_name,desc);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    puVar1 = (this->state_).data;
    OVar2 = (this->state_).offset;
    *(undefined8 *)out_value->v = *(undefined8 *)(puVar1 + OVar2);
    *(undefined8 *)(out_value->v + 8) = *(undefined8 *)(puVar1 + OVar2 + 8);
    (this->state_).offset = (this->state_).offset + 0x10;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadT(T* out_value,
                           const char* type_name,
                           const char* desc) {
  if (state_.offset + sizeof(T) > read_end_) {
    PrintError("unable to read %s: %s", type_name, desc);
    return Result::Error;
  }
#if WABT_BIG_ENDIAN
  uint8_t tmp[sizeof(T)];
  memcpy(tmp, state_.data + state_.offset, sizeof(tmp));
  SwapBytesSized(tmp, sizeof(tmp));
  memcpy(out_value, tmp, sizeof(T));
#else
  memcpy(out_value, state_.data + state_.offset, sizeof(T));
#endif
  state_.offset += sizeof(T);
  return Result::Ok;
}